

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3_vtab_collation(sqlite3_index_info *pIdxInfo,int iCons)

{
  int iVar1;
  CollSeq *pCVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  
  if ((iCons < 0) || (pIdxInfo->nConstraint <= iCons)) {
    pcVar5 = (char *)0x0;
  }
  else {
    iVar1 = pIdxInfo->aConstraint[(uint)iCons].iTermOffset;
    for (lVar4 = *(long *)(pIdxInfo + 1); *(int *)(lVar4 + 0x14) <= iVar1;
        lVar4 = *(long *)(lVar4 + 8)) {
      iVar1 = iVar1 - *(int *)(lVar4 + 0x14);
    }
    lVar4 = *(long *)(*(long *)(lVar4 + 0x20) + (long)iVar1 * 0x38);
    pcVar5 = "BINARY";
    if (*(long *)(lVar4 + 0x10) != 0) {
      uVar3 = *(uint *)(lVar4 + 4) & 0x400;
      pCVar2 = sqlite3BinaryCompareCollSeq
                         ((Parse *)pIdxInfo[1].aConstraint,
                          *(Expr **)(lVar4 + 0x10 + (ulong)(uVar3 >> 7)),
                          *(Expr **)(lVar4 + 0x10 + (ulong)(uVar3 == 0) * 8));
      if (pCVar2 != (CollSeq *)0x0) {
        pcVar5 = pCVar2->zName;
      }
    }
  }
  return pcVar5;
}

Assistant:

SQLITE_API const char *sqlite3_vtab_collation(sqlite3_index_info *pIdxInfo, int iCons){
  HiddenIndexInfo *pHidden = (HiddenIndexInfo*)&pIdxInfo[1];
  const char *zRet = 0;
  if( iCons>=0 && iCons<pIdxInfo->nConstraint ){
    CollSeq *pC = 0;
    int iTerm = pIdxInfo->aConstraint[iCons].iTermOffset;
    Expr *pX = termFromWhereClause(pHidden->pWC, iTerm)->pExpr;
    if( pX->pLeft ){
      pC = sqlite3ExprCompareCollSeq(pHidden->pParse, pX);
    }
    zRet = (pC ? pC->zName : sqlite3StrBINARY);
  }
  return zRet;
}